

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltablib.c
# Opt level: O1

void auxsort(lua_State *L,IdxT lo,IdxT up,uint rnd)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  uint lo_00;
  ulong n;
  ulong n_00;
  ulong n_01;
  ulong n_02;
  
  n = (ulong)lo;
  do {
    lo_00 = (uint)n;
    uVar6 = up - lo_00;
    if (up < lo_00 || uVar6 == 0) {
      return;
    }
    lua_geti(L,1,n);
    uVar5 = (ulong)up;
    lua_geti(L,1,uVar5);
    iVar2 = sort_comp(L,-1,-2);
    if (iVar2 == 0) {
      lua_settop(L,-3);
    }
    else {
      lua_seti(L,1,n);
      lua_seti(L,1,uVar5);
    }
    if (uVar6 == 1) {
      bVar1 = false;
    }
    else {
      if (rnd == 0 || uVar6 < 100) {
        uVar4 = up + lo_00 >> 1;
      }
      else {
        uVar4 = (uVar6 >> 2) + lo_00 + (up ^ lo_00 ^ rnd) % ((uVar6 >> 2) * 2);
      }
      n_00 = (ulong)uVar4;
      lua_geti(L,1,n_00);
      lua_geti(L,1,n);
      iVar2 = sort_comp(L,-2,-1);
      if (iVar2 == 0) {
        lua_settop(L,-2);
        lua_geti(L,1,uVar5);
        iVar2 = sort_comp(L,-1,-2);
        if (iVar2 != 0) {
          lua_seti(L,1,n_00);
          goto LAB_0011c7fc;
        }
        lua_settop(L,-3);
      }
      else {
        lua_seti(L,1,n_00);
        uVar5 = n;
LAB_0011c7fc:
        lua_seti(L,1,uVar5);
      }
      if (uVar6 == 2) {
        bVar1 = false;
      }
      else {
        lua_geti(L,1,n_00);
        lua_pushvalue(L,-1);
        n_01 = (ulong)(up - 1);
        lua_geti(L,1,n_01);
        uVar5 = n;
        n_02 = n_01;
        do {
          lua_seti(L,1,n_00);
          lua_seti(L,1,n_02);
          iVar2 = (int)uVar5;
          n_00 = (ulong)(iVar2 + 1);
          lua_geti(L,1,n_00);
          iVar3 = sort_comp(L,-1,-2);
          uVar5 = n_00;
          if (iVar3 != 0) {
            uVar6 = iVar2 + 2;
            do {
              uVar4 = uVar6;
              if (up == uVar4) {
                luaL_error(L,"invalid order function for sorting");
              }
              lua_settop(L,-2);
              n_00 = (ulong)uVar4;
              lua_geti(L,1,n_00);
              iVar2 = sort_comp(L,-1,-2);
              uVar6 = uVar4 + 1;
            } while (iVar2 != 0);
            uVar5 = (ulong)uVar4;
          }
          while( true ) {
            uVar6 = (int)n_02 - 1;
            n_02 = (ulong)uVar6;
            lua_geti(L,1,n_02);
            iVar2 = sort_comp(L,-3,-1);
            uVar4 = (uint)uVar5;
            if (iVar2 == 0) break;
            if (uVar6 < uVar4) {
              luaL_error(L,"invalid order function for sorting");
            }
            lua_settop(L,-2);
          }
        } while (uVar4 <= uVar6);
        lua_settop(L,-2);
        lua_seti(L,1,n_01);
        lua_seti(L,1,n_00);
        uVar6 = up - uVar4;
        if (uVar4 - lo_00 < uVar6) {
          auxsort(L,lo_00,uVar4 - 1,rnd);
          n = (ulong)(uVar4 + 1);
          uVar6 = uVar4 - lo_00;
        }
        else {
          auxsort(L,uVar4 + 1,up,rnd);
          up = uVar4 - 1;
        }
        bVar1 = true;
        if (uVar6 < up - (int)n >> 7) {
          rnd = luaL_makeseed(L);
        }
      }
    }
    if (!bVar1) {
      return;
    }
  } while( true );
}

Assistant:

static void auxsort (lua_State *L, IdxT lo, IdxT up, unsigned rnd) {
  while (lo < up) {  /* loop for tail recursion */
    IdxT p;  /* Pivot index */
    IdxT n;  /* to be used later */
    /* sort elements 'lo', 'p', and 'up' */
    geti(L, 1, lo);
    geti(L, 1, up);
    if (sort_comp(L, -1, -2))  /* a[up] < a[lo]? */
      set2(L, lo, up);  /* swap a[lo] - a[up] */
    else
      lua_pop(L, 2);  /* remove both values */
    if (up - lo == 1)  /* only 2 elements? */
      return;  /* already sorted */
    if (up - lo < RANLIMIT || rnd == 0)  /* small interval or no randomize? */
      p = (lo + up)/2;  /* middle element is a good pivot */
    else  /* for larger intervals, it is worth a random pivot */
      p = choosePivot(lo, up, rnd);
    geti(L, 1, p);
    geti(L, 1, lo);
    if (sort_comp(L, -2, -1))  /* a[p] < a[lo]? */
      set2(L, p, lo);  /* swap a[p] - a[lo] */
    else {
      lua_pop(L, 1);  /* remove a[lo] */
      geti(L, 1, up);
      if (sort_comp(L, -1, -2))  /* a[up] < a[p]? */
        set2(L, p, up);  /* swap a[up] - a[p] */
      else
        lua_pop(L, 2);
    }
    if (up - lo == 2)  /* only 3 elements? */
      return;  /* already sorted */
    geti(L, 1, p);  /* get middle element (Pivot) */
    lua_pushvalue(L, -1);  /* push Pivot */
    geti(L, 1, up - 1);  /* push a[up - 1] */
    set2(L, p, up - 1);  /* swap Pivot (a[p]) with a[up - 1] */
    p = partition(L, lo, up);
    /* a[lo .. p - 1] <= a[p] == P <= a[p + 1 .. up] */
    if (p - lo < up - p) {  /* lower interval is smaller? */
      auxsort(L, lo, p - 1, rnd);  /* call recursively for lower interval */
      n = p - lo;  /* size of smaller interval */
      lo = p + 1;  /* tail call for [p + 1 .. up] (upper interval) */
    }
    else {
      auxsort(L, p + 1, up, rnd);  /* call recursively for upper interval */
      n = up - p;  /* size of smaller interval */
      up = p - 1;  /* tail call for [lo .. p - 1]  (lower interval) */
    }
    if ((up - lo) / 128 > n) /* partition too imbalanced? */
      rnd = l_randomizePivot(L);  /* try a new randomization */
  }  /* tail call auxsort(L, lo, up, rnd) */
}